

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

field_type_t __thiscall cfgfile::generator::cfg::field_type_from_string(cfg *this,string *type)

{
  int iVar1;
  field_type_t fVar2;
  
  if (_DAT_0013f3c0 == type) {
    if (type == (string *)0x0) {
      return scalar_field_type;
    }
    iVar1 = bcmp(this,c_scalar_tag_name_abi_cxx11_,(size_t)type);
    if (iVar1 == 0) {
      return scalar_field_type;
    }
  }
  if (DAT_0013f3e0 == type) {
    if (type == (string *)0x0) {
      return no_value_field_type;
    }
    iVar1 = bcmp(this,c_no_value_tag_name_abi_cxx11_,(size_t)type);
    if (iVar1 == 0) {
      return no_value_field_type;
    }
  }
  if (DAT_0013f400 == type) {
    if (type == (string *)0x0) {
      return scalar_vector_field_type;
    }
    iVar1 = bcmp(this,c_scalar_vector_tag_name_abi_cxx11_,(size_t)type);
    if (iVar1 == 0) {
      return scalar_vector_field_type;
    }
  }
  if (DAT_0013f420 == type) {
    if (type == (string *)0x0) {
      return vector_of_tags_field_type;
    }
    iVar1 = bcmp(this,c_vector_of_tags_tag_name_abi_cxx11_,(size_t)type);
    if (iVar1 == 0) {
      return vector_of_tags_field_type;
    }
  }
  fVar2 = unknown_field_type;
  if (DAT_0013f440 == type) {
    if ((type != (string *)0x0) &&
       (iVar1 = bcmp(this,c_custom_tag_name_abi_cxx11_,(size_t)type), iVar1 != 0)) {
      return unknown_field_type;
    }
    fVar2 = custom_tag_field_type;
  }
  return fVar2;
}

Assistant:

static inline field_t::field_type_t field_type_from_string( const std::string & type )
{
	if( type == c_scalar_tag_name )
		return field_t::scalar_field_type;
	else if( type == c_no_value_tag_name )
		return field_t::no_value_field_type;
	else if( type == c_scalar_vector_tag_name )
		return field_t::scalar_vector_field_type;
	else if( type == c_vector_of_tags_tag_name )
		return field_t::vector_of_tags_field_type;
	else if( type == c_custom_tag_name )
		return field_t::custom_tag_field_type;
	else
		return field_t::unknown_field_type;
}